

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O3

void AddPoint(fstream *fin)

{
  istream *piVar1;
  int id;
  double y;
  double x;
  int local_1c;
  double local_18;
  double local_10;
  
  std::istream::operator>>((istream *)fin,&local_1c);
  piVar1 = std::istream::_M_extract<double>((double *)fin);
  std::istream::_M_extract<double>((double *)piVar1);
  switch(environment_variable) {
  case 2:
    AddPointFromAddPointBeforeQueryPolygon(local_1c,local_10,local_18);
    break;
  case 3:
    AddPointFromAddBeforeQuery(local_1c,local_10,local_18);
    break;
  default:
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,
               "Good morning, and in case I don\'t see ya, good afternoon, good evening, and good night!"
               ,0x57);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x38);
    std::ostream::put(-0x38);
    std::ostream::flush();
    break;
  case 5:
    AddPointFromMixQueryPolygon(local_1c,local_10,local_18);
    break;
  case 6:
    AddPointFromMixQuery(local_1c,local_10,local_18);
  }
  return;
}

Assistant:

void AddPoint(std::fstream &fin) {
    int id;
    double x;
    double y;
    fin >> id;
    fin >> x >> y;

    switch (environment_variable) {
        case 2: {
            AddPointFromAddPointBeforeQueryPolygon(id, x, y);
            break;
        }
        case 3: {
            AddPointFromAddBeforeQuery(id, x, y);
            break;
        }
        case 5: {
            AddPointFromMixQueryPolygon(id, x, y);
            break;
        }
        case 6: {
            AddPointFromMixQuery(id, x, y);
            break;
        }
        default:
            std::cout << "Good morning, and in case I don't see ya, good afternoon, good evening, and good night!" << std::endl;
    }
}